

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ilist.h
# Opt level: O3

void __thiscall
spvtools::utils::IntrusiveList<spvtools::opt::Instruction>::~IntrusiveList
          (IntrusiveList<spvtools::opt::Instruction> *this)

{
  char cVar1;
  Instruction *pIVar2;
  Instruction *pIVar3;
  Instruction *pIVar4;
  
  this->_vptr_IntrusiveList = (_func_int **)&PTR__IntrusiveList_00b02f90;
  pIVar2 = (this->sentinel_).super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  if (pIVar2 != (Instruction *)0x0) {
    cVar1 = (pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_;
    while (cVar1 == '\0') {
      pIVar3 = (pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      if (pIVar3 == (Instruction *)0x0) {
        __assert_fail("this->IsInAList() && \"Cannot remove a node from a list if it is not in a list.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/util/ilist_node.h"
                      ,0xcc,
                      "void spvtools::utils::IntrusiveNodeBase<spvtools::opt::Instruction>::RemoveFromList() [NodeType = spvtools::opt::Instruction]"
                     );
      }
      pIVar4 = (pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_;
      (pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ = pIVar4;
      (pIVar4->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = pIVar3;
      (pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = (Instruction *)0x0;
      (pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ =
           (Instruction *)0x0;
      pIVar2 = (this->sentinel_).super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
      if (pIVar2 == (Instruction *)0x0) break;
      cVar1 = (pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_;
    }
  }
  opt::Instruction::~Instruction(&this->sentinel_);
  return;
}

Assistant:

IntrusiveList<NodeType>::~IntrusiveList() {
  clear();
}